

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O0

AnnotationHeader * __thiscall
lrit::HeaderReader<lrit::AnnotationHeader>::getHeader(HeaderReader<lrit::AnnotationHeader> *this)

{
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  HeaderReader<lrit::AnnotationHeader> *in_RSI;
  AnnotationHeader *in_RDI;
  AnnotationHeader *this_00;
  
  this_00 = in_RDI;
  read(in_RSI,(int)in_RSI + 0x10,in_RDX,in_RCX);
  read(in_RSI,(int)in_RSI + 0x12,__buf,in_RCX);
  AnnotationHeader::AnnotationHeader(this_00,(AnnotationHeader *)in_RSI);
  return in_RDI;
}

Assistant:

H getHeader() {
    read(&h_.headerType);
    read(&h_.headerLength);
    return h_;
  }